

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

bool ValidatePlayerClass(PClassActor *ti,char *name)

{
  bool bVar1;
  char *name_local;
  PClassActor *ti_local;
  
  if (ti == (PClassActor *)0x0) {
    Printf("Unknown player class \'%s\'\n",name);
    ti_local._7_1_ = false;
  }
  else {
    bVar1 = PClass::IsDescendantOf(&ti->super_PClass,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar1) {
      bVar1 = FString::IsEmpty((FString *)(ti + 1));
      if (bVar1) {
        Printf("Missing displayname for player class \'%s\'\n",name);
        ti_local._7_1_ = false;
      }
      else {
        ti_local._7_1_ = true;
      }
    }
    else {
      Printf("Invalid player class \'%s\'\n",name);
      ti_local._7_1_ = false;
    }
  }
  return ti_local._7_1_;
}

Assistant:

bool ValidatePlayerClass(PClassActor *ti, const char *name)
{
	if (ti == NULL)
	{
		Printf("Unknown player class '%s'\n", name);
		return false;
	}
	else if (!ti->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
	{
		Printf("Invalid player class '%s'\n", name);
		return false;
	}
	else if (static_cast<PClassPlayerPawn *>(ti)->DisplayName.IsEmpty())
	{
		Printf ("Missing displayname for player class '%s'\n", name);
		return false;
	}
	return true;
}